

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_font * rf_load_ttf_font_from_file
                    (rf_font *__return_storage_ptr__,char *filename,int font_size,
                    rf_font_antialias antialias,rf_allocator allocator,rf_allocator temp_allocator,
                    rf_io_callbacks io)

{
  rf_allocator allocator_00;
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  void *font_file_data;
  rf_font_antialias antialias_00;
  _Bool _Var5;
  rf_int rVar6;
  uint uStack_254;
  int local_21c [95];
  rf_font local_a0;
  undefined8 local_68;
  long local_60;
  undefined4 local_58;
  uint uStack_54;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  void *local_38;
  void *data;
  rf_font_antialias local_28;
  int file_size;
  rf_font_antialias antialias_local;
  int font_size_local;
  char *filename_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  filename_local = (char *)allocator.user_data;
  local_28 = antialias;
  file_size = font_size;
  _antialias_local = filename;
  memset(__return_storage_ptr__,0,0x38);
  _Var5 = rf_is_file_extension(_antialias_local,".ttf");
  if ((_Var5) || (_Var5 = rf_is_file_extension(_antialias_local,".otf"), _Var5)) {
    rVar6 = (*io.file_size_proc)(io.user_data,_antialias_local);
    data._4_4_ = (int)rVar6;
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_48 = "rf_load_ttf_font_from_file";
    local_40 = 0x5c45;
    local_68 = 0;
    local_60 = (long)data._4_4_;
    local_58 = 0;
    rVar1.proc_name = "rf_load_ttf_font_from_file";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x5c45;
    auVar4._8_8_ = (ulong)uStack_54 << 0x20;
    auVar4._0_8_ = local_60;
    auVar4._16_8_ = 0;
    local_38 = (*temp_allocator.allocator_proc)
                         (&temp_allocator,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
    _Var5 = (*io.read_file_proc)(io.user_data,_antialias_local,local_38,(long)data._4_4_);
    antialias_00 = local_28;
    font_file_data = local_38;
    if (_Var5) {
      memcpy(local_21c,
             L" !\"#$%&\'()*+,-./0123456789:;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\]^_`abcdefghijklmnopqrstuvwxyz{|}~"
             ,0x17c);
      allocator_00.allocator_proc = (rf_allocator_proc *)allocator_local.user_data;
      allocator_00.user_data = filename_local;
      rf_load_ttf_font_from_data
                (&local_a0,font_file_data,0x40,antialias_00,local_21c,0x60,allocator_00,
                 temp_allocator);
      memcpy(__return_storage_ptr__,&local_a0,0x38);
      rf_set_texture_filter(__return_storage_ptr__->texture,RF_FILTER_POINT);
    }
    rVar2.proc_name = "rf_load_ttf_font_from_file";
    rVar2.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar2.line_in_file = 0x5c4f;
    rVar3.size_to_allocate_or_reallocate = 0;
    rVar3.pointer_to_free_or_realloc = local_38;
    rVar3._16_8_ = (ulong)uStack_254 << 0x20;
    (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_load_ttf_font_from_file(const char* filename, int font_size, rf_font_antialias antialias, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_font font = {0};

    if (rf_is_file_extension(filename, ".ttf") || rf_is_file_extension(filename, ".otf"))
    {
        int file_size = RF_FILE_SIZE(io, filename);
        void* data = RF_ALLOC(temp_allocator, file_size);

        if (RF_READ_FILE(io, filename, data, file_size))
        {
            font = rf_load_ttf_font_from_data(data, RF_DEFAULT_FONT_SIZE, antialias, (int[]) RF_BUILTIN_FONT_CHARS, RF_BUILTIN_CODEPOINTS_COUNT, allocator, temp_allocator);

            // By default we set point filter (best performance)
            rf_set_texture_filter(font.texture, RF_FILTER_POINT);
        }

        RF_FREE(temp_allocator, data);
    }

    return font;
}